

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O2

void JSONWorker::NewNode(internalJSONNode *parent,json_string *name,json_string *value,bool array)

{
  internalJSONNode *internal_t;
  JSONNode *this;
  undefined7 in_register_00000009;
  json_string *pjVar1;
  char *pcVar2;
  allocator local_91;
  json_string local_90;
  long local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  json_string _comment;
  
  _comment._M_dataplus._M_p = (pointer)&_comment.field_2;
  _comment._M_string_length = 0;
  pjVar1 = name;
  if ((int)CONCAT71(in_register_00000009,array) != 0) {
    pjVar1 = value;
  }
  _comment.field_2._M_local_buf[0] = '\0';
  pcVar2 = (pjVar1->_M_dataplus)._M_p;
  if (*pcVar2 == '#') {
    local_58 = pcVar2 + value->_M_string_length;
    while( true ) {
      local_60 = pcVar2 + 1;
      local_70 = 0;
      for (pcVar2 = pcVar2 + 2; local_68 = pcVar2 + -1, pcVar2[-1] != '#'; pcVar2 = pcVar2 + 1) {
        std::__cxx11::string::string((string *)&local_90,"Removing white space failed",&local_91);
        JSONDebug::_JSON_ASSERT(local_68 != local_58,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        local_70 = local_70 + -1;
      }
      if (local_70 != 0) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,local_60,local_68);
        std::__cxx11::string::append((string *)&_comment);
        std::__cxx11::string::~string((string *)&local_90);
      }
      if (*pcVar2 != '#') break;
      std::__cxx11::string::push_back((char)&_comment);
    }
  }
  if (array) {
    std::__cxx11::string::string((string *)&local_90,pcVar2,&local_91);
    internal_t = internalJSONNode::newInternal(name,&local_90);
  }
  else {
    std::__cxx11::string::string((string *)&local_90,pcVar2 + 1,&local_91);
    internal_t = internalJSONNode::newInternal(&local_90,value);
  }
  std::__cxx11::string::~string((string *)&local_90);
  this = ::JSONNode::newJSONNode(internal_t);
  ::JSONNode::set_comment(this,&_comment);
  jsonChildren::push_back(parent->Children,this);
  std::__cxx11::string::~string((string *)&_comment);
  return;
}

Assistant:

inline void JSONWorker::NewNode(const internalJSONNode * parent, const json_string & name, const json_string & value, ARRAY_PARAM) json_nothrow {
    #ifdef JSON_COMMENTS
	   JSONNode * child;
	   START_MEM_SCOPE
		  json_string _comment;
		  START_MEM_SCOPE
			 const json_char * runner = ((array) ? value.data() : name.data());
			 #ifdef JSON_DEBUG
				const json_char * const end = runner + value.length();
			#endif
			 if (json_unlikely(*runner == JSON_TEMP_COMMENT_IDENTIFIER)){  //multiple comments will be consolidated into one
				size_t count;
				const json_char * start;
			    newcomment:
				count = 0;
				start = runner + 1;
				while(*(++runner) != JSON_TEMP_COMMENT_IDENTIFIER){
				    JSON_ASSERT(runner != end, JSON_TEXT("Removing white space failed"));
					++count;
				}
				if (count) _comment += json_string(start, count);
				if (json_unlikely(*(++runner) == JSON_TEMP_COMMENT_IDENTIFIER)){ //step past the trailing tag
				    _comment += JSON_TEXT('\n');
				    goto newcomment;
				}
			 }
			 internalJSONNode * myinternal;
			 if (array){
				myinternal = internalJSONNode::newInternal(name, runner);
			 } else {
				myinternal = internalJSONNode::newInternal(++runner, value);
			 }
			 child = JSONNode::newJSONNode(myinternal);
		  END_MEM_SCOPE
		  child -> set_comment(_comment);
	   END_MEM_SCOPE
	   const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(child);   //attach it to the parent node
    #else
	if (name.empty()){
	   	const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(JSONNode::newJSONNode(internalJSONNode::newInternal(name, value)));	    //attach it to the parent node
	} else {
		const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(JSONNode::newJSONNode(internalJSONNode::newInternal(json_string(name.begin() + 1, name.end()), value)));	    //attach it to the parent node
	}
    #endif
}